

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modules.cpp
# Opt level: O3

void module2(uint W)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  char **ppcVar3;
  Graph *pGVar4;
  code *pcVar5;
  double dVar6;
  long *plVar7;
  FlowBuilder FVar8;
  char extraout_AL;
  bool bVar9;
  char extraout_AL_00;
  int iVar10;
  Node *pNVar11;
  long lVar12;
  int iVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar15;
  int cnt;
  int local_4f0;
  in_place_type_t<tf::Node::Module> local_4e9;
  Result local_4e8;
  undefined8 local_4c8;
  undefined4 local_4c0;
  ResultBuilder DOCTEST_RB;
  Task m2_2;
  Task m2_1;
  Task m1_2;
  Task D;
  Task C;
  Task B;
  Taskflow f1;
  Task m1_1;
  Task E;
  Task A;
  shared_ptr<tf::WorkerInterface> local_328;
  Taskflow f2;
  Future<void> local_250;
  Taskflow f0;
  Executor executor;
  
  local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_328);
  if (local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  cnt = 0;
  f0.super_FlowBuilder._graph = &f0._graph;
  f0._mutex.super___mutex_base._M_mutex.__align = 0;
  f0._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f0._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f0._name._M_dataplus._M_p = (pointer)&f0._name.field_2;
  f0._name._M_string_length = 0;
  f0._name.field_2._M_local_buf[0] = '\0';
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f0._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f0._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f0._topologies,0);
  FVar8._graph = f0.super_FlowBuilder._graph;
  f0._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:118:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:118:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  pNVar11 = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  pGVar4 = (Graph *)(&f1._mutex.super___mutex_base._M_mutex.__align + 1);
  f1.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f1,"f0A","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  A._node = pNVar11;
  if (f1.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f1.super_FlowBuilder._graph,f1._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:119:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:119:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  pNVar11 = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f1,"f0B","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  B._node = pNVar11;
  if (f1.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f1.super_FlowBuilder._graph,f1._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:120:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:120:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  pNVar11 = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f1,"f0C","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  C._node = pNVar11;
  if (f1.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f1.super_FlowBuilder._graph,f1._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:121:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:121:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  pNVar11 = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f1,"f0D","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  D._node = pNVar11;
  if (f1.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f1.super_FlowBuilder._graph,f1._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  FVar8._graph = f0.super_FlowBuilder._graph;
  f1.super_FlowBuilder._graph = (Graph *)operator_new(0xd8);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 1);
  ((f1.super_FlowBuilder._graph)->
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ).
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[1].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  f1.super_FlowBuilder._graph[1].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[2].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(f1.super_FlowBuilder._graph + 4);
  f1.super_FlowBuilder._graph[3].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&f1.super_FlowBuilder._graph[5].
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1.super_FlowBuilder._graph[5].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cnt;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:122:23)>
                ::_M_invoke;
  f1.super_FlowBuilder._graph[6].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp:122:23)>
                ::_M_manager;
  *(undefined1 *)
   &f1.super_FlowBuilder._graph[8].
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1.super_FlowBuilder._graph[8].
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar8._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&f1);
  if (f1.super_FlowBuilder._graph != (Graph *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&f1,(Node *)f1.super_FlowBuilder._graph);
  }
  pNVar11 = ((FVar8._graph)->
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ).
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
            super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
            super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  f1.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f1,"f0E","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  E._node = pNVar11;
  if (f1.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f1.super_FlowBuilder._graph,f1._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  tf::Task::precede<tf::Task&>(&A,&B);
  tf::Task::precede<tf::Task&>(&B,&C);
  tf::Task::precede<tf::Task&>(&C,&D);
  tf::Task::precede<tf::Task&>(&D,&E);
  f1.super_FlowBuilder._graph = &f1._graph;
  f1._mutex.super___mutex_base._M_mutex.__align = 0;
  f1._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f1._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f1._name._M_dataplus._M_p = (pointer)&f1._name.field_2;
  f1._name._M_string_length = 0;
  f1._name.field_2._M_local_buf[0] = '\0';
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f1._topologies,0);
  f1._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  f2.super_FlowBuilder._graph = (Graph *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_4e8._0_8_ = (ulong)(uint)local_4e8._4_4_ << 0x20;
  pNVar11 = tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                      (f1.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       (DefaultTaskParams *)&local_4c8,(void **)&f2,(void **)&DOCTEST_RB,
                       (int *)&local_4e8,(in_place_type_t<tf::Node::Module> *)&m1_2,&f0);
  pGVar4 = (Graph *)(&f2._mutex.super___mutex_base._M_mutex.__align + 1);
  f2.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f2,"m1_1","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  m1_1._node = pNVar11;
  if (f2.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f2.super_FlowBuilder._graph,f2._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  f2.super_FlowBuilder._graph = (Graph *)0x0;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffff00000000;
  pNVar11 = tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                      (f1.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       (DefaultTaskParams *)&local_4c8,(void **)&f2,(void **)&DOCTEST_RB,
                       (int *)&local_4e8,(in_place_type_t<tf::Node::Module> *)&m2_1,&f0);
  f2.super_FlowBuilder._graph = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f2,"m1_2","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  m1_2._node = pNVar11;
  if (f2.super_FlowBuilder._graph != pGVar4) {
    operator_delete(f2.super_FlowBuilder._graph,f2._mutex.super___mutex_base._M_mutex._8_8_ + 1);
  }
  tf::Task::precede<tf::Task&>(&m1_1,&m1_2);
  f2.super_FlowBuilder._graph = &f2._graph;
  f2._mutex.super___mutex_base._M_mutex.__align = 0;
  f2._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  f2._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  f2._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  f2._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  f2._name._M_dataplus._M_p = (pointer)&f2._name.field_2;
  f2._name._M_string_length = 0;
  f2._name.field_2._M_local_buf[0] = '\0';
  f2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  f2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&f2._topologies,0);
  f2._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_4e8.m_passed = false;
  local_4e8._1_7_ = 0;
  local_4c8 = (int *)((ulong)local_4c8._4_4_ << 0x20);
  pNVar11 = tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                      (f2.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       (DefaultTaskParams *)&m2_2,(void **)&DOCTEST_RB,(void **)&local_4e8,
                       (int *)&local_4c8,(in_place_type_t<tf::Node::Module> *)&local_4f0,&f1);
  ppcVar3 = &DOCTEST_RB.super_AssertData.m_file;
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)ppcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&DOCTEST_RB,"m2_1","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  m2_1._node = pNVar11;
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)ppcVar3) {
    operator_delete(DOCTEST_RB.super_AssertData.m_test_case,
                    (ulong)(DOCTEST_RB.super_AssertData.m_file + 1));
  }
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_4e8.m_passed = false;
  local_4e8._1_7_ = 0;
  local_4c8 = (int *)((ulong)local_4c8 & 0xffffffff00000000);
  pNVar11 = tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                      (f2.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       (DefaultTaskParams *)&local_4f0,(void **)&DOCTEST_RB,(void **)&local_4e8,
                       (int *)&local_4c8,&local_4e9,&f1);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)ppcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&DOCTEST_RB,"m2_2","");
  std::__cxx11::string::_M_assign((string *)&pNVar11->_name);
  m2_2._node = pNVar11;
  if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)ppcVar3) {
    operator_delete(DOCTEST_RB.super_AssertData.m_test_case,
                    (ulong)(DOCTEST_RB.super_AssertData.m_file + 1));
  }
  tf::Task::precede<tf::Task&>(&m2_1,&m2_2);
  iVar13 = 0;
  lVar12 = 0;
  do {
    cnt = 0;
    local_4e8._0_8_ = lVar12;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,&executor,&f2,(anon_class_8_1_69701ed9 *)&local_4e8,
               (anon_class_1_0_00000001 *)&local_4c8);
    std::future<void>::get((future<void> *)&DOCTEST_RB);
    plVar7 = (long *)CONCAT44(DOCTEST_RB.super_AssertData._28_4_,DOCTEST_RB.super_AssertData.m_line)
    ;
    if (plVar7 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar7 + 0xc);
        iVar10 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar10 = *(int *)((long)plVar7 + 0xc);
        *(int *)((long)plVar7 + 0xc) = iVar10 + -1;
      }
      if (iVar10 == 1) {
        (**(code **)(*plVar7 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at));
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x93;
    DOCTEST_RB.super_AssertData.m_expr = "cnt == 20*n";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_4c8 = &cnt;
    local_4c0 = 0xc;
    local_4f0 = iVar13;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_4e8,(Expression_lhs<int_const&> *)&local_4c8,&local_4f0);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_4e8.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_4e8.m_passed) ^ 1;
    uVar14 = extraout_XMM0_Da;
    uVar15 = extraout_XMM0_Db;
    if ((local_4e8.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_4e8.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_4e8.m_decomp.field_0.data.ptr);
      uVar14 = extraout_XMM0_Da_00;
      uVar15 = extraout_XMM0_Db_00;
    }
    dVar6 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar15,uVar14));
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)(SUB84(dVar6,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar9 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar9) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    lVar12 = lVar12 + 1;
    iVar13 = iVar13 + 0x14;
  } while (lVar12 != 100);
  cnt = 0;
  iVar13 = 100;
  do {
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x1;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              (&local_250,&executor,&f2,(anon_class_8_1_69701ed9 *)&DOCTEST_RB,
               (anon_class_1_0_00000001 *)&local_4e8);
    if (local_250._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_250._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar10 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar10 = (local_250._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_weak_count;
        (local_250._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar10 + -1;
      }
      if (iVar10 == 1) {
        (*(local_250._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_250.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_250.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&executor._topology_mutex;
  DOCTEST_RB.super_AssertData.m_at =
       DOCTEST_RB.super_AssertData.m_at &
       ~(is_nothrow|is_throws_with|is_throws_as|is_throws|DT_REQUIRE|is_check|is_warn);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_at = CONCAT31(DOCTEST_RB.super_AssertData.m_at._1_3_,1);
  if (executor._num_topologies != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&executor._topology_cv);
    } while (executor._num_topologies != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_modules.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x9c;
  DOCTEST_RB.super_AssertData.m_expr = "cnt == 100*20";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_4c8 = &cnt;
  local_4c0 = 0xc;
  local_4f0 = 2000;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_4e8,(Expression_lhs<int_const&> *)&local_4c8,&local_4f0);
  doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_4e8.m_decomp);
  DOCTEST_RB.super_AssertData._40_2_ =
       CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_4e8.m_passed) ^ 1;
  uVar14 = extraout_XMM0_Da_01;
  uVar15 = extraout_XMM0_Db_01;
  if ((local_4e8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_4e8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_4e8.m_decomp.field_0.data.ptr);
    uVar14 = extraout_XMM0_Da_02;
    uVar15 = extraout_XMM0_Db_02;
  }
  dVar6 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar15,uVar14));
  if (extraout_AL_00 != '\0') {
    pcVar5 = (code *)swi(3);
    (*pcVar5)(SUB84(dVar6,0));
    return;
  }
  if (DOCTEST_RB.super_AssertData.m_failed == true) {
    bVar9 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
    if (bVar9) {
      doctest::detail::throwException();
    }
  }
  if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                       DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
  }
  tf::Taskflow::~Taskflow(&f2);
  tf::Taskflow::~Taskflow(&f1);
  tf::Taskflow::~Taskflow(&f0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void module2(unsigned W) {

  tf::Executor executor(W);

  int cnt {0};

  // level 0 (+5)
  tf::Taskflow f0;

  auto A = f0.emplace([&cnt](){ ++cnt; }).name("f0A");
  auto B = f0.emplace([&cnt](){ ++cnt; }).name("f0B");
  auto C = f0.emplace([&cnt](){ ++cnt; }).name("f0C");
  auto D = f0.emplace([&cnt](){ ++cnt; }).name("f0D");
  auto E = f0.emplace([&cnt](){ ++cnt; }).name("f0E");

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);

  // level 1 (+10)
  tf::Taskflow f1;
  auto m1_1 = f1.composed_of(f0).name("m1_1");
  auto m1_2 = f1.composed_of(f0).name("m1_2");
  m1_1.precede(m1_2);

  // level 2 (+20)
  tf::Taskflow f2;
  auto m2_1 = f2.composed_of(f1).name("m2_1");
  auto m2_2 = f2.composed_of(f1).name("m2_2");
  m2_1.precede(m2_2);

  //f2.dump(std::cout);

  // synchronous run
  for(int n=0; n<100; n++) {
    cnt = 0;
    executor.run_n(f2, n).get();
    REQUIRE(cnt == 20*n);
  }

  // asynchronous run
  cnt = 0;
  for(int n=0; n<100; n++) {
    executor.run(f2);
  }
  executor.wait_for_all();
  REQUIRE(cnt == 100*20);
 
}